

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int canconnect(_glist *x,t_object *src,int nout,t_object *sink,int nin)

{
  int iVar1;
  bool local_3d;
  int nin_local;
  t_object *sink_local;
  int nout_local;
  t_object *src_local;
  _glist *x_local;
  
  if ((((src != (t_object *)0x0) && (sink != (t_object *)0x0)) && (sink != src)) &&
     ((iVar1 = obj_ninlets(sink), nin < iVar1 && (iVar1 = obj_noutlets(src), nout < iVar1)))) {
    iVar1 = canvas_isconnected(x,src,nout,sink,nin);
    if (iVar1 == 0) {
      iVar1 = obj_issignaloutlet(src,nout);
      local_3d = true;
      if (iVar1 != 0) {
        iVar1 = obj_issignalinlet(sink,nin);
        local_3d = iVar1 != 0;
      }
      return (uint)local_3d;
    }
    return 0;
  }
  return 0;
}

Assistant:

static int canconnect(t_canvas*x, t_object*src, int nout, t_object*sink, int nin)
{
    if (!src || !sink || sink == src) /* do source and sink exist (and are not the same)?*/
        return 0;
    if (nin >= obj_ninlets(sink) || (nout >= obj_noutlets(src))) /* do the requested iolets exist? */
        return 0;
    if (canvas_isconnected(x, src, nout, sink, nin)) /* are the objects already connected? */
        return 0;
    return (!obj_issignaloutlet(src, nout) || /* are the iolets compatible? */
            obj_issignalinlet(sink, nin));
}